

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscrete::CreateNewObservationModel
          (MultiAgentDecisionProcessDiscrete *this)

{
  void *pvVar1;
  int extraout_var;
  long *in_RDI;
  undefined8 in_stack_ffffffffffffff50;
  int iVar2;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  ObservationModelMappingSparse *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  EventObservationModelMappingSparse *in_stack_ffffffffffffff80;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  if (((*(byte *)(in_RDI + 0x3c) & 1) != 0) && ((long *)in_RDI[0x3e] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[0x3e] + 8))();
  }
  if ((*(byte *)((long)in_RDI + 0x1e2) & 1) == 0) {
    iVar2 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    if ((*(byte *)((long)in_RDI + 0x1e1) & 1) == 0) {
      pvVar1 = operator_new(0x30);
      (**(code **)(*in_RDI + 0x30))();
      (**(code **)(*in_RDI + 0x70))();
      (**(code **)(*in_RDI + 0xd0))();
      ObservationModelMapping::ObservationModelMapping
                ((ObservationModelMapping *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 in_stack_ffffffffffffff58,iVar2);
      in_RDI[0x3e] = (long)pvVar1;
    }
    else {
      pvVar1 = operator_new(0x30);
      (**(code **)(*in_RDI + 0x30))();
      (**(code **)(*in_RDI + 0x70))();
      (**(code **)(*in_RDI + 0xd0))();
      ObservationModelMappingSparse::ObservationModelMappingSparse
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,iVar2
                );
      in_RDI[0x3e] = (long)pvVar1;
    }
  }
  else if ((*(byte *)((long)in_RDI + 0x1e1) & 1) == 0) {
    pvVar1 = operator_new(0x30);
    (**(code **)(*in_RDI + 0x30))();
    (**(code **)(*in_RDI + 0x70))();
    (**(code **)(*in_RDI + 0xd0))();
    EventObservationModelMapping::EventObservationModelMapping
              ((EventObservationModelMapping *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff78,iVar2);
    in_RDI[0x3e] = (long)pvVar1;
  }
  else {
    pvVar1 = operator_new(0x30);
    (**(code **)(*in_RDI + 0x30))();
    iVar2 = extraout_var;
    (**(code **)(*in_RDI + 0x70))();
    (**(code **)(*in_RDI + 0xd0))();
    EventObservationModelMappingSparse::EventObservationModelMappingSparse
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,iVar2);
    in_RDI[0x3e] = (long)pvVar1;
  }
  return;
}

Assistant:

void MultiAgentDecisionProcessDiscrete::CreateNewObservationModel()
{
    if(_m_initialized)
        delete(_m_p_oModel);
    if(!_m_eventObservability)
    {
        if(_m_sparse)
            _m_p_oModel = new 
                ObservationModelMappingSparse(GetNrStates(), 
                                              GetNrJointActions(),
                                              GetNrJointObservations());
        else 
            _m_p_oModel = new 
                ObservationModelMapping(GetNrStates(),
                                        GetNrJointActions(), 
                                        GetNrJointObservations());
    }
    else
    {
        if(_m_sparse)
            _m_p_oModel = new 
                EventObservationModelMappingSparse(GetNrStates(), 
                                                   GetNrJointActions(),
                                                   GetNrJointObservations());
        else
            _m_p_oModel = new 
                EventObservationModelMapping(GetNrStates(), 
                                             GetNrJointActions(),
                                             GetNrJointObservations());
    }
}